

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

void * Highs_getCallbackDataOutItem(HighsCallbackDataOut *data_out,char *item_name)

{
  int iVar1;
  char *in_RSI;
  void *in_RDI;
  void *local_8;
  
  iVar1 = strcmp(in_RSI,"log_type");
  local_8 = in_RDI;
  if (iVar1 != 0) {
    iVar1 = strcmp(in_RSI,"running_time");
    if (iVar1 == 0) {
      local_8 = (void *)((long)in_RDI + 8);
    }
    else {
      iVar1 = strcmp(in_RSI,"simplex_iteration_count");
      if (iVar1 == 0) {
        local_8 = (void *)((long)in_RDI + 0x10);
      }
      else {
        iVar1 = strcmp(in_RSI,"ipm_iteration_count");
        if (iVar1 == 0) {
          local_8 = (void *)((long)in_RDI + 0x14);
        }
        else {
          iVar1 = strcmp(in_RSI,"pdlp_iteration_count");
          if (iVar1 == 0) {
            local_8 = (void *)((long)in_RDI + 0x18);
          }
          else {
            iVar1 = strcmp(in_RSI,"objective_function_value");
            if (iVar1 == 0) {
              local_8 = (void *)((long)in_RDI + 0x20);
            }
            else {
              iVar1 = strcmp(in_RSI,"mip_node_count");
              if (iVar1 == 0) {
                local_8 = (void *)((long)in_RDI + 0x28);
              }
              else {
                iVar1 = strcmp(in_RSI,"mip_total_lp_iterations");
                if (iVar1 == 0) {
                  local_8 = (void *)((long)in_RDI + 0x30);
                }
                else {
                  iVar1 = strcmp(in_RSI,"mip_primal_bound");
                  if (iVar1 == 0) {
                    local_8 = (void *)((long)in_RDI + 0x38);
                  }
                  else {
                    iVar1 = strcmp(in_RSI,"mip_dual_bound");
                    if (iVar1 == 0) {
                      local_8 = (void *)((long)in_RDI + 0x40);
                    }
                    else {
                      iVar1 = strcmp(in_RSI,"mip_gap");
                      if (iVar1 == 0) {
                        local_8 = (void *)((long)in_RDI + 0x48);
                      }
                      else {
                        iVar1 = strcmp(in_RSI,"mip_solution");
                        if (iVar1 == 0) {
                          local_8 = *(void **)((long)in_RDI + 0x50);
                        }
                        else {
                          iVar1 = strcmp(in_RSI,"cutpool_num_col");
                          if (iVar1 == 0) {
                            local_8 = (void *)((long)in_RDI + 0x58);
                          }
                          else {
                            iVar1 = strcmp(in_RSI,"cutpool_num_cut");
                            if (iVar1 == 0) {
                              local_8 = (void *)((long)in_RDI + 0x5c);
                            }
                            else {
                              iVar1 = strcmp(in_RSI,"cutpool_num_nz");
                              if (iVar1 == 0) {
                                local_8 = (void *)((long)in_RDI + 0x60);
                              }
                              else {
                                iVar1 = strcmp(in_RSI,"cutpool_start");
                                if (iVar1 == 0) {
                                  local_8 = *(void **)((long)in_RDI + 0x68);
                                }
                                else {
                                  iVar1 = strcmp(in_RSI,"cutpool_index");
                                  if (iVar1 == 0) {
                                    local_8 = *(void **)((long)in_RDI + 0x70);
                                  }
                                  else {
                                    iVar1 = strcmp(in_RSI,"cutpool_value");
                                    if (iVar1 == 0) {
                                      local_8 = *(void **)((long)in_RDI + 0x78);
                                    }
                                    else {
                                      iVar1 = strcmp(in_RSI,"cutpool_lower");
                                      if (iVar1 == 0) {
                                        local_8 = *(void **)((long)in_RDI + 0x80);
                                      }
                                      else {
                                        iVar1 = strcmp(in_RSI,"cutpool_upper");
                                        if (iVar1 == 0) {
                                          local_8 = *(void **)((long)in_RDI + 0x88);
                                        }
                                        else {
                                          local_8 = (void *)0x0;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

const void* Highs_getCallbackDataOutItem(const HighsCallbackDataOut* data_out,
                                         const char* item_name) {
  // Accessor function for HighsCallbackDataOut
  //
  // Remember that pointers in HighsCallbackDataOut don't need to be referenced!
  if (!strcmp(item_name, kHighsCallbackDataOutLogTypeName)) {
    return (void*)(&data_out->log_type);
  } else if (!strcmp(item_name, kHighsCallbackDataOutRunningTimeName)) {
    return (void*)(&data_out->running_time);
  } else if (!strcmp(item_name,
                     kHighsCallbackDataOutSimplexIterationCountName)) {
    return (void*)(&data_out->simplex_iteration_count);
  } else if (!strcmp(item_name, kHighsCallbackDataOutIpmIterationCountName)) {
    return (void*)(&data_out->ipm_iteration_count);
  } else if (!strcmp(item_name, kHighsCallbackDataOutPdlpIterationCountName)) {
    return (void*)(&data_out->pdlp_iteration_count);
  } else if (!strcmp(item_name,
                     kHighsCallbackDataOutObjectiveFunctionValueName)) {
    return (void*)(&data_out->objective_function_value);
  } else if (!strcmp(item_name, kHighsCallbackDataOutMipNodeCountName)) {
    return (void*)(&data_out->mip_node_count);
  } else if (!strcmp(item_name,
                     kHighsCallbackDataOutMipTotalLpIterationsName)) {
    return (void*)(&data_out->mip_total_lp_iterations);
  } else if (!strcmp(item_name, kHighsCallbackDataOutMipPrimalBoundName)) {
    return (void*)(&data_out->mip_primal_bound);
  } else if (!strcmp(item_name, kHighsCallbackDataOutMipDualBoundName)) {
    return (void*)(&data_out->mip_dual_bound);
  } else if (!strcmp(item_name, kHighsCallbackDataOutMipGapName)) {
    return (void*)(&data_out->mip_gap);
  } else if (!strcmp(item_name, kHighsCallbackDataOutMipSolutionName)) {
    return (void*)(data_out->mip_solution);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolNumColName)) {
    return (void*)(&data_out->cutpool_num_col);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolNumCutName)) {
    return (void*)(&data_out->cutpool_num_cut);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolNumNzName)) {
    return (void*)(&data_out->cutpool_num_nz);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolStartName)) {
    return (void*)(data_out->cutpool_start);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolIndexName)) {
    return (void*)(data_out->cutpool_index);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolValueName)) {
    return (void*)(data_out->cutpool_value);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolLowerName)) {
    return (void*)(data_out->cutpool_lower);
  } else if (!strcmp(item_name, kHighsCallbackDataOutCutpoolUpperName)) {
    return (void*)(data_out->cutpool_upper);
  }
  return nullptr;
}